

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_get_string_length(coda_cursor *cursor,long *length)

{
  int iVar1;
  long local_28;
  int64_t bit_size;
  long *length_local;
  coda_cursor *cursor_local;
  
  bit_size = (int64_t)length;
  length_local = (long *)cursor;
  iVar1 = coda_mem_cursor_get_bit_size(cursor,&local_28);
  if (iVar1 == 0) {
    if (local_28 < 0) {
      *(undefined8 *)bit_size = 0xffffffffffffffff;
    }
    else {
      *(long *)bit_size = local_28 >> 3;
    }
    cursor_local._4_4_ = 0;
  }
  else {
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_get_string_length(const coda_cursor *cursor, long *length)
{
    int64_t bit_size;

    if (coda_mem_cursor_get_bit_size(cursor, &bit_size) != 0)
    {
        return -1;
    }
    if (bit_size < 0)
    {
        *length = -1;
    }
    else
    {
        *length = (long)(bit_size >> 3);
    }

    return 0;
}